

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::String> __thiscall
kj::AsyncInputStream::readAllText(AsyncInputStream *this,uint64_t limit)

{
  PromiseNode **this_00;
  AllReader *limit_00;
  PromiseNode *extraout_RDX;
  Promise<kj::String> PVar1;
  undefined1 local_40 [8];
  Promise<kj::String> promise;
  Own<kj::(anonymous_namespace)::AllReader> reader;
  uint64_t limit_local;
  AsyncInputStream *this_local;
  
  this_00 = &promise.super_PromiseBase.node.ptr;
  heap<kj::(anonymous_namespace)::AllReader,kj::AsyncInputStream&>
            ((kj *)this_00,(AsyncInputStream *)limit);
  limit_00 = Own<kj::(anonymous_namespace)::AllReader>::operator->
                       ((Own<kj::(anonymous_namespace)::AllReader> *)this_00);
  anon_unknown_77::AllReader::readAllText((AllReader *)local_40,(uint64_t)limit_00);
  mv<kj::Own<kj::(anonymous_namespace)::AllReader>>
            ((Own<kj::(anonymous_namespace)::AllReader> *)&promise.super_PromiseBase.node.ptr);
  Promise<kj::String>::attach<kj::Own<kj::(anonymous_namespace)::AllReader>>
            ((Promise<kj::String> *)this,(Own<kj::(anonymous_namespace)::AllReader> *)local_40);
  Promise<kj::String>::~Promise((Promise<kj::String> *)local_40);
  Own<kj::(anonymous_namespace)::AllReader>::~Own
            ((Own<kj::(anonymous_namespace)::AllReader> *)&promise.super_PromiseBase.node.ptr);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::String>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<String> AsyncInputStream::readAllText(uint64_t limit) {
  auto reader = kj::heap<AllReader>(*this);
  auto promise = reader->readAllText(limit);
  return promise.attach(kj::mv(reader));
}